

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_qcc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  uint_fast16_t uVar1;
  uchar *ptr;
  int iVar2;
  undefined8 in_RAX;
  uint_fast8_t tmp;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  uVar1 = ms->len;
  if (cstate->numcomps < 0x101) {
    iVar2 = jpc_getuint8(in,&local_21);
    if (iVar2 != 0) {
      return -1;
    }
    *(ulong *)&ms->parms = (ulong)local_21;
    iVar2 = -1;
  }
  else {
    iVar2 = jpc_getuint16(in,(uint_fast16_t *)&(ms->parms).soc);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = -2;
  }
  iVar2 = jpc_qcx_getcompparms
                    ((jpc_qcxcp_t *)&(ms->parms).qcd.compparms.stepsizes,(jpc_cstate_t *)in,
                     (jas_stream_t *)(long)((int)uVar1 + iVar2),0);
  if (iVar2 == 0) {
    if ((in->flags_ & 1) == 0) {
      return 0;
    }
    ptr = (ms->parms).ppm.data;
    if (ptr != (uchar *)0x0) {
      jas_free(ptr);
    }
  }
  return -1;
}

Assistant:

static int jpc_qcc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	uint_fast8_t tmp;
	int len;
	len = ms->len;
	if (cstate->numcomps <= 256) {
		if (jpc_getuint8(in, &tmp)) {
			return -1;
		}
		qcc->compno = tmp;
		--len;
	} else {
		if (jpc_getuint16(in, &qcc->compno)) {
			return -1;
		}
		len -= 2;
	}
	if (jpc_qcx_getcompparms(&qcc->compparms, cstate, in, len)) {
		return -1;
	}
	if (jas_stream_eof(in)) {
		jpc_qcc_destroyparms(ms);
		return -1;
	}
	return 0;
}